

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall
HModel::util_reportRowMtx
          (HModel *this,int nrow,vector<int,_std::allocator<int>_> *XARstart,
          vector<int,_std::allocator<int>_> *XARindex,
          vector<double,_std::allocator<double>_> *XARvalue)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < nrow) {
    puts("Row    Index       Value");
    uVar3 = 0;
    do {
      printf("%6d Start %8d\n",uVar3 & 0xffffffff,
             (ulong)(uint)(XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
      piVar2 = (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar2[uVar3];
      lVar5 = (long)iVar1;
      uVar4 = uVar3 + 1;
      if (iVar1 < piVar2[uVar3 + 1]) {
        do {
          printf("      %6d %11g\n",
                 (XARvalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar5],
                 (ulong)(uint)(XARindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 < (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar4]);
      }
      uVar3 = uVar4;
    } while (uVar4 != (uint)nrow);
    printf("       Start %8d\n",
           (ulong)(uint)(XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[(uint)nrow]);
    return;
  }
  return;
}

Assistant:

void HModel::util_reportRowMtx(int nrow, vector<int>& XARstart, vector<int>& XARindex, vector<double>& XARvalue) {
  // Report the row-wise matrix passed to the method
  if (nrow <= 0) return;
  printf("Row    Index       Value\n");
  for (int row = 0; row < nrow; row++) {
    printf("%6d Start %8d\n", row, XARstart[row]);
    for (int el = XARstart[row]; el < XARstart[row+1]; el++) {
      printf("      %6d %11g\n", XARindex[el], XARvalue[el]);
    }
  }
    printf("       Start %8d\n", XARstart[nrow]);
}